

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O1

int fits_make_histde(fitsfile *fptr,fitsfile *histptr,int *datatypes,int bitpix,int naxis,
                    long *naxes,int *colnum,char **colexpr,double *amin,double *amax,double *binsize
                    ,double weight,int wtcolnum,char *wtexpr,int recip,char *selectrow,int *status)

{
  char *expr;
  bool bVar1;
  bool bVar2;
  fitsfile *pfVar3;
  uint uVar4;
  int iVar5;
  ulong extraout_RAX;
  ulong uVar7;
  long lVar8;
  double dVar9;
  int *piVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  ulong local_b08;
  iteratorCol *local_b00;
  int local_af4;
  long wtrepeat;
  fitsfile *local_ae0;
  double local_ad8;
  int datatype;
  int *local_ac8;
  long nelem;
  long colrepeat;
  fitsfile *local_ab0;
  long nrows;
  int local_a9c;
  double double_nulval;
  ulong local_a90;
  long *local_a88;
  double local_a80;
  double local_a78;
  int naxis1;
  int datatype_1;
  double tmin [4];
  double maxbin [4];
  double tbin [4];
  double taxes [4];
  histType histData;
  iteratorCol imagepars [1];
  ParseData parsers [5];
  parseInfo infos [5];
  ulong uVar6;
  
  nrows = -1;
  double_nulval = -9.1191291391491e-36;
  wtrepeat = 0;
  if (0 < *status) {
    return *status;
  }
  local_ac8 = datatypes;
  memset(infos,0,0x2d0);
  memset(parsers,0,0x488);
  memset(&histData,0,0x130);
  if (4 < naxis) {
    ffpmsg("histogram has more than 4 dimensions");
    *status = 0x140;
    return 0x140;
  }
  if (bitpix < 8) {
    if (bitpix == -0x40) {
      iVar5 = 0x52;
    }
    else {
      if (bitpix != -0x20) {
LAB_0017a118:
        *status = 0x19a;
        return 0x19a;
      }
      iVar5 = 0x2a;
    }
  }
  else if (bitpix == 8) {
    iVar5 = 0xb;
  }
  else if (bitpix == 0x20) {
    iVar5 = 0x1f;
  }
  else {
    if (bitpix != 0x10) goto LAB_0017a118;
    iVar5 = 0x15;
  }
  local_ae0 = histptr;
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (wtcolnum < 1) {
    if ((((wtexpr != (char *)0x0) && (weight == 0.0)) && (!NAN(weight))) && (*wtexpr != '\0'))
    goto LAB_0017a10e;
  }
  else if ((weight == 0.0) && (!NAN(weight))) {
LAB_0017a10e:
    weight = -9.1191291391491e-36;
  }
  histData.wtcolnum = wtcolnum;
  histData.wtexpr = wtexpr;
  histData.wtrecip = recip;
  histData.rowselector = selectrow;
  local_b08._0_4_ = 0;
  histData.tblptr = fptr;
  histData.haxis = naxis;
  histData.himagetype = iVar5;
  histData.weight = weight;
  local_b00 = (iteratorCol *)fits_recalloc((void *)0x0,0,5,0x110);
  if (local_b00 == (iteratorCol *)0x0) {
    ffpmsg("memory allocation failure (fits_make_histde)");
    *status = 0x71;
    local_b00 = (iteratorCol *)0x0;
    goto LAB_0017aa2e;
  }
  histData.startCols[0] = -1;
  histData.startCols[1] = -1;
  histData.startCols[2] = -1;
  histData.startCols[3] = -1;
  histData.startCols[4] = -1;
  local_ab0 = fptr;
  local_a9c = iVar5;
  if (naxis < 1) {
    local_af4 = 5;
    dVar12 = 0.0;
  }
  else {
    local_a90 = (ulong)(uint)naxis;
    local_af4 = 5;
    uVar7 = 0;
    local_b08 = 0;
    dVar9 = 0.0;
    piVar10 = local_ac8;
    local_a88 = naxes;
    do {
      pfVar3 = local_ab0;
      colrepeat = 0;
      iVar5 = (int)local_b08;
      histData.startCols[uVar7] = iVar5;
      local_a80 = (double)local_a88[uVar7];
      taxes[uVar7] = local_a80;
      dVar12 = amin[uVar7];
      tmin[uVar7] = dVar12;
      dVar13 = amax[uVar7];
      if (((dVar13 < dVar12) && (0.0 < binsize[uVar7])) ||
         ((dVar12 < dVar13 && (binsize[uVar7] <= 0.0 && binsize[uVar7] != 0.0)))) {
        dVar14 = -binsize[uVar7];
      }
      else {
        dVar14 = binsize[uVar7];
      }
      tbin[uVar7] = dVar14;
      if (((colexpr == (char **)0x0) || (colexpr[uVar7] == (char *)0x0)) ||
         (*colexpr[uVar7] == '\0')) {
        local_ad8 = dVar12;
        local_a78 = dVar13;
        ffeqty(local_ab0,colnum[uVar7],&datatype,&colrepeat,(long *)0x0,status);
        dVar12 = local_ad8;
        dVar13 = local_a78;
      }
      if ((piVar10 != (int *)0x0) && (piVar10[uVar7] != 0)) {
        datatype = piVar10[uVar7];
      }
      if ((((0x29 < datatype) || (dVar12 != (double)(long)dVar12)) ||
          ((NAN(dVar12) || NAN((double)(long)dVar12) ||
           (((dVar13 != (double)(long)dVar13 || (NAN(dVar13) || NAN((double)(long)dVar13))) ||
            (dVar14 != (double)(long)dVar14)))))) || (NAN(dVar14) || NAN((double)(long)dVar14))) {
        maxbin[uVar7] = (dVar13 - dVar12) / dVar14;
      }
      else {
        maxbin[uVar7] = local_a80 + 1.0;
        if (dVar13 <= dVar12) {
          dVar12 = dVar12 + 0.5;
        }
        else {
          dVar12 = dVar12 + -0.5;
        }
        tmin[uVar7] = dVar12;
      }
      if (((colexpr == (char **)0x0) || (expr = colexpr[uVar7], expr == (char *)0x0)) ||
         (*expr == '\0')) {
        fits_iter_set_by_num(local_b00 + iVar5,pfVar3,colnum[uVar7],0x52,0);
        local_b08 = (ulong)(iVar5 + 1);
LAB_0017a4fc:
        piVar10 = local_ac8;
        bVar2 = false;
        uVar6 = colrepeat;
        dVar12 = (double)colrepeat;
        if ((dVar9 != 0.0) && (dVar12 = dVar9, bVar2 = false, dVar9 != (double)colrepeat)) {
          ffpmsg("vector dimensions of binning values do not agree");
          *status = 0x140;
          bVar2 = true;
          uVar6 = extraout_RAX;
        }
      }
      else {
        uVar4 = ffiprs(pfVar3,0,expr,5,&datatype_1,&nelem,&naxis1,(long *)imagepars,parsers + uVar7,
                       status);
        uVar6 = (ulong)uVar4;
        if (*status == 0) {
          if (nelem < 0) {
            nelem = 1;
          }
          colrepeat = nelem;
          ffgnrw(local_ab0,&nrows,status);
          uVar4 = fits_parser_set_temporary_col
                            (parsers + uVar7,infos + uVar7,nrows,&double_nulval,status);
          uVar6 = (ulong)uVar4;
          if (uVar4 != 0) goto LAB_0017a4ab;
          local_b00 = (iteratorCol *)
                      fits_recalloc(local_b00,(long)local_af4,
                                    (long)parsers[uVar7].nCols + (long)local_af4,0x110);
          if (local_b00 == (iteratorCol *)0x0) {
            *status = 0x71;
            local_b00 = (iteratorCol *)0x0;
            uVar6 = 0;
            goto LAB_0017a4ab;
          }
          uVar4 = parsers[uVar7].nCols;
          uVar6 = (ulong)uVar4;
          local_af4 = local_af4 + uVar4;
          bVar1 = true;
          bVar2 = false;
          if (0 < (int)uVar4) {
            lVar8 = 0;
            lVar11 = 0;
            local_ad8 = dVar9;
            do {
              memcpy(local_b00[iVar5].colname + lVar8 + -0xc,
                     (parsers[uVar7].colData)->colname + lVar8 + -0xc,0x110);
              lVar11 = lVar11 + 1;
              lVar8 = lVar8 + 0x110;
            } while (lVar11 < parsers[uVar7].nCols);
            uVar6 = (ulong)(uint)(iVar5 + (int)lVar11);
            bVar1 = true;
            dVar9 = local_ad8;
            local_b08 = uVar6;
            bVar2 = false;
          }
        }
        else {
LAB_0017a4ab:
          bVar1 = false;
          bVar2 = true;
        }
        dVar12 = dVar9;
        piVar10 = local_ac8;
        if (bVar1) goto LAB_0017a4fc;
      }
      if (bVar2) {
        if (!bVar2) {
          return (int)uVar6;
        }
        goto LAB_0017aa2e;
      }
      uVar7 = uVar7 + 1;
      dVar9 = dVar12;
    } while (uVar7 != local_a90);
  }
  pfVar3 = local_ab0;
  if ((((wtexpr == (char *)0x0) || (weight != -9.1191291391491e-36)) || (NAN(weight))) ||
     (*wtexpr == '\0')) {
    dVar9 = dVar12;
    if ((weight == -9.1191291391491e-36) && (!NAN(weight))) {
      ffeqty(local_ab0,wtcolnum,(int *)imagepars,&wtrepeat,(long *)0x0,status);
      histData.startCols[4] = (int)local_b08;
      fits_iter_set_by_num(local_b00 + (int)local_b08,pfVar3,wtcolnum,0x52,0);
      local_b08._0_4_ = (int)local_b08 + 1;
      dVar9 = (double)wtrepeat;
    }
  }
  else {
    histData.startCols[4] = (int)local_b08;
    ffiprs(local_ab0,0,wtexpr,5,(int *)&colrepeat,&wtrepeat,(int *)&nelem,(long *)imagepars,
           parsers + 4,status);
    if (*status == 0) {
      if (wtrepeat < 0) {
        wtrepeat = 1;
      }
      ffgnrw(local_ab0,&nrows,status);
      iVar5 = fits_parser_set_temporary_col(parsers + 4,infos + 4,nrows,&double_nulval,status);
      if (iVar5 != 0) goto LAB_0017a71e;
      local_b00 = (iteratorCol *)
                  fits_recalloc(local_b00,(long)local_af4,(long)parsers[4].nCols + (long)local_af4,
                                0x110);
      if (local_b00 == (iteratorCol *)0x0) {
        *status = 0x71;
        local_b00 = (iteratorCol *)0x0;
        bVar1 = false;
      }
      else {
        bVar1 = true;
        if (0 < parsers[4].nCols) {
          lVar11 = 0;
          lVar8 = 0;
          local_ad8 = dVar12;
          do {
            memcpy(local_b00[(int)local_b08].colname + lVar11 + -0xc,
                   (parsers[4].colData)->colname + lVar11 + -0xc,0x110);
            lVar8 = lVar8 + 1;
            lVar11 = lVar11 + 0x110;
          } while (lVar8 < parsers[4].nCols);
          local_b08._0_4_ = (int)local_b08 + (int)lVar8;
          dVar12 = local_ad8;
        }
      }
    }
    else {
LAB_0017a71e:
      bVar1 = false;
    }
    dVar9 = (double)wtrepeat;
    if (!bVar1) goto LAB_0017aa2e;
  }
  wtrepeat = (long)dVar9;
  if (((wtrepeat == 0) || (dVar12 == 0.0)) || ((double)wtrepeat == dVar12)) {
    histData.numIterCols = (int)local_b08;
    histData.hcolnum[0] = *colnum;
    histData.amin1 = tmin[0];
    histData.maxbin1 = maxbin[0];
    histData.binsize1 = tbin[0];
    histData.haxis1 = (long)taxes[0];
    histData.incr[0] = 1;
    if (1 < histData.haxis) {
      histData.hcolnum[1] = colnum[1];
      histData.amin2 = tmin[1];
      histData.maxbin2 = maxbin[1];
      histData.haxis2 = (long)taxes[1];
      histData.binsize2 = tbin[1];
      histData.incr[1] = histData.haxis1;
      if (histData.haxis != 2) {
        histData.hcolnum[2] = colnum[2];
        histData.amin3 = tmin[2];
        histData.maxbin3 = maxbin[2];
        histData.binsize3 = tbin[2];
        histData.haxis3 = (long)taxes[2];
        histData.incr[2] = histData.haxis2 * histData.haxis1;
        if (3 < histData.haxis) {
          histData.hcolnum[3] = colnum[3];
          histData.amin4 = tmin[3];
          histData.maxbin4 = maxbin[3];
          histData.haxis4 = (long)taxes[3];
          histData.binsize4 = tbin[3];
          histData.incr[3] = histData.incr[2] * histData.haxis3;
        }
      }
    }
    histData.repeat = (long)dVar12;
    histData.iterCols = local_b00;
    histData.parsers = parsers;
    histData.infos = infos;
    fits_iter_set_file(imagepars,local_ae0);
    fits_iter_set_datatype(imagepars,local_a9c);
    fits_iter_set_iotype(imagepars,2);
    ffiter(1,imagepars,0,-1,ffwritehisto,&histData,status);
  }
  else {
    ffpmsg("vector dimensions of weights do not agree with bins");
    *status = 0x140;
  }
LAB_0017aa2e:
  if (local_b00 != (iteratorCol *)0x0) {
    free(local_b00);
  }
  lVar8 = 0;
  do {
    if (0 < *(int *)((long)parsers[0].nAxes + lVar8 + -0x18)) {
      ffcprs((ParseData *)((long)parsers[0].nAxes + lVar8 + -0x78));
    }
    lVar8 = lVar8 + 0xe8;
  } while (lVar8 != 0x488);
  return *status;
}

Assistant:

int fits_make_histde(fitsfile *fptr, /* IO - pointer to table with X and Y cols; */
    fitsfile *histptr, /* I - pointer to output FITS image      */
    int *datatypes,   /*  I - datatype of input (or 0 for auto) */
    int bitpix,       /* I - datatype for image: 16, 32, -32, etc    */
    int naxis,        /* I - number of axes in the histogram image   */
    long *naxes,      /* I - size of axes in the histogram image   */
    int *colnum,      /* I - column numbers (array length = naxis)   */
    char *colexpr[4], /* I - optional expression instead of column */
    double *amin,     /* I - minimum histogram value, for each axis */
    double *amax,     /* I - maximum histogram value, for each axis */
    double *binsize,  /* I - bin size along each axis               */
    double weight,    /* I - binning weighting factor (0 or DOUBLENULLVALUE means null) */
    int wtcolnum,     /* I - optional keyword or col for weight*/
    char *wtexpr,     /* I - optional weighting expression */
		      /*  disambiguation of weight values */
		      /*    non-null weight: use that value */
		      /*    null weight: use wtexpr if non-null, else wtcolnum */
    int recip,              /* I - use reciprocal of the weight?     */
    char *selectrow,        /* I - optional array (length = no. of   */
                             /* rows in the table).  If the element is true */
                             /* then the corresponding row of the table will*/
                             /* be included in the histogram, otherwise the */
                             /* row will be skipped.  Ingnored if *selectrow*/
                             /* is equal to NULL.                           */
    int *status)
{		  
    int ii, imagetype;
    int n_cols = 1;
    long imin, imax, ibin;
    long  offset = 0;
    long n_per_loop = -1;  /* force whole array to be passed at one time */
    double taxes[4], tmin[4], tmax[4], tbin[4], maxbin[4];
    histType histData;    /* Structure holding histogram info for iterator */
    iteratorCol imagepars[1];
    long nrows = -1;
    ParseData parsers[5];
    parseInfo infos[5];
    int numAllocCols = 0, startCol = -1, numIterCols = 0;
    iteratorCol *iterCols = 0;
    double double_nulval = DOUBLENULLVALUE;
    long repeat = 0, wtrepeat = 0;

    /* check inputs */
    
    if (*status > 0)
        return(*status);

    /* Make sure the parser information is initialized because we will
       use this to determine what needs to be deallocated at the end */
    memset(infos, 0, sizeof(infos));
    memset(parsers, 0, sizeof(parsers));
    memset(&histData, 0, sizeof(histData));

    if (naxis > 4)
    {
        ffpmsg("histogram has more than 4 dimensions");
        return(*status = BAD_DIMEN);
    }

    if   (bitpix == BYTE_IMG)
         imagetype = TBYTE;
    else if (bitpix == SHORT_IMG)
         imagetype = TSHORT;
    else if (bitpix == LONG_IMG)
         imagetype = TINT;    
    else if (bitpix == FLOAT_IMG)
         imagetype = TFLOAT;    
    else if (bitpix == DOUBLE_IMG)
         imagetype = TDOUBLE;    
    else
        return(*status = BAD_DATATYPE);

    /* reset position to the correct HDU if necessary */
    if ((fptr)->HDUposition != ((fptr)->Fptr)->curhdu)
        ffmahd(fptr, ((fptr)->HDUposition) + 1, NULL, status);

    /* Resolve the conflict between wtexpr, wtcolnum, and weight */
    if ( ((wtcolnum > 0) || (wtexpr && wtexpr[0])) && weight == 0 ) weight = DOUBLENULLVALUE;
    histData.weight     = weight;
    histData.wtcolnum   = wtcolnum;
    histData.wtexpr     = wtexpr;
    histData.wtrecip    = recip;
    histData.tblptr     = fptr;
    histData.himagetype = imagetype;
    histData.haxis      = naxis;
    histData.rowselector = selectrow;

    /* Now make iterator columns for input, as well as any calculated values */
    numAllocCols = 5;
    iterCols = fits_recalloc(0, 0, numAllocCols, sizeof(iteratorCol));
    if (!iterCols) {
      ffpmsg("memory allocation failure (fits_make_histde)");
      *status = MEMORY_ALLOCATION;
      goto cleanup;
    }

    /* We fill the iterCols in order, starting from column 1 through 4, and 
       then moving on to the weighting column */
    for (ii = 0; ii < 5; ii++)  histData.startCols[ii] = -1;
    startCol = 0;

    /* Loop through each axis and recheck the binning parameters */
    for (ii = 0; ii < naxis; ii++)
    {
      long colrepeat = 0;
      int datatype;
      histData.startCols[ii] = startCol;

      taxes[ii] = (double) naxes[ii];
      tmin[ii] = amin[ii];
      tmax[ii] = amax[ii];
      if ( (amin[ii] > amax[ii] && binsize[ii] > 0. ) ||
           (amin[ii] < amax[ii] && binsize[ii] < 0. ) )
          tbin[ii] =  -binsize[ii];  /* reverse the sign of binsize */
      else
          tbin[ii] =   binsize[ii];  /* binsize has the correct sign */
          
      imin = (long) tmin[ii];
      imax = (long) tmax[ii];
      ibin = (long) tbin[ii];
    
      /* get the datatype of the column and repeat */
      if (! (colexpr && colexpr[ii] && colexpr[ii][0]) ) {
	fits_get_eqcoltype(fptr, colnum[ii], &datatype, &colrepeat, NULL, status);
      }

      /* If caller specified datatype, use that */
      if (datatypes && datatypes[ii]) {
	datatype = datatypes[ii];
      }

      if (datatype <= TLONG && (double) imin == tmin[ii] &&
                               (double) imax == tmax[ii] &&
                               (double) ibin == tbin[ii] )
      {
        /* This is an integer column and integer limits were entered. */
        /* Shift the lower and upper histogramming limits by 0.5, so that */
        /* the values fall in the center of the bin, not on the edge. */

        maxbin[ii] = (taxes[ii] + 1.F);  /* add 1. instead of .5 to avoid roundoff */

        if (tmin[ii] < tmax[ii])
        {
          tmin[ii] = tmin[ii] - 0.5F;
          tmax[ii] = tmax[ii] + 0.5F;
        }
        else
        {
          tmin[ii] = tmin[ii] + 0.5F;
          tmax[ii] = tmax[ii] - 0.5F;
        }
      } else {  /* not an integer column with integer limits */
          maxbin[ii] = (tmax[ii] - tmin[ii]) / tbin[ii]; 
      }

      /* This is a column expression.  Here is where we allocate the 
	 parser for it during the actual evaluation. */
      if (colexpr && colexpr[ii] && colexpr[ii][0]) {
	int datatype, naxis1;
	long nelem, naxes[MAXDIMS];
	int jj;

	/* Initialize the parser for this binning expression */
	ffiprs( fptr, 0, colexpr[ii], MAXDIMS, &datatype, &nelem, &naxis1,
		naxes, &(parsers[ii]), status );
	if (*status) goto cleanup;
	if (nelem < 0) nelem = 1; /* If it's a constant expression */

	colrepeat = nelem;

	/* Set up the parser data for evaluation to a TemporaryCol */
	fits_get_num_rows(fptr, &nrows, status);
	if (fits_parser_set_temporary_col(&(parsers[ii]), &(infos[ii]), nrows,
					  (void *) &(double_nulval), status)) goto cleanup;

	/* Copy iterator columns from the parser to the master iterator columns */
	iterCols = fits_recalloc(iterCols, numAllocCols, numAllocCols+parsers[ii].nCols,
			    sizeof(iteratorCol));
	if (!iterCols) {
	  *status = MEMORY_ALLOCATION;
	  goto cleanup;
	}
	numAllocCols += parsers[ii].nCols;
	for (jj = 0; jj < parsers[ii].nCols; jj++) iterCols[startCol++] = parsers[ii].colData[jj];

      } else {

	/* Just a "regular" column name, we already have enough allocated for these */
	fits_iter_set_by_num(&(iterCols[startCol]), fptr, colnum[ii], TDOUBLE, InputCol);
	startCol ++;
      }

      /* Check that all the vector dimensions agree */
      if (repeat == 0) {
	repeat = colrepeat;
      } else {
	if (repeat != colrepeat) {
	  ffpmsg("vector dimensions of binning values do not agree");
	  *status = BAD_DIMEN;
	  goto cleanup;
	}
      }

    } /* End of loop over columns */

    /* Now initialize the iterator column data for the weighting */
    if (wtexpr && wtexpr[0] && weight == DOUBLENULLVALUE) {
      int wtdatatype, wtnaxis;
      long wtnaxes[MAXDIMS];
      int jj;

      histData.startCols[4] = startCol;
      ffiprs( fptr, 0, wtexpr, MAXDIMS, &wtdatatype, &wtrepeat, &wtnaxis,
	      wtnaxes, &(parsers[4]), status );
      if (*status) goto cleanup;
      if (wtrepeat < 0) wtrepeat = 1; /* If it's a constant expression */

      /* Set up the parser data for evaluation to a TemporaryCol */
      /* It's a weighting expression, set that up and ... */
      fits_get_num_rows(fptr, &nrows, status);
      if (fits_parser_set_temporary_col(&(parsers[4]), &(infos[4]), nrows,
					(void *) &(double_nulval), status)) goto cleanup;

      /* Copy iterator columns from the parser to the master iterator columns */
      iterCols = fits_recalloc(iterCols, numAllocCols, numAllocCols+parsers[4].nCols,
			  sizeof(iteratorCol));
      if (!iterCols) {
	*status = MEMORY_ALLOCATION;
	goto cleanup;
      }
      numAllocCols += parsers[ii].nCols;
      for (jj = 0; jj < parsers[4].nCols; jj++) iterCols[startCol++] = parsers[4].colData[jj];

    } else if (weight == DOUBLENULLVALUE) {
      int wtdatatype;

      /* It's a "regular" weighting column */
      fits_get_eqcoltype(fptr, wtcolnum, &wtdatatype, &wtrepeat, NULL, status);

      histData.startCols[4] = startCol;
      fits_iter_set_by_num(&(iterCols[startCol]), fptr, wtcolnum, TDOUBLE, InputCol);
      startCol ++;
    } else {

      /* In case of explicit numerical value, we can just use that number
	 in the vector expression, so the vector repeat of the weighting can
	 be set to that of the input */
      wtrepeat = repeat;
    }

    /* Vector dimension of weighting must agree with binning */
    if (wtrepeat != 0 && repeat != 0 && wtrepeat != repeat) {
      ffpmsg("vector dimensions of weights do not agree with bins");
      *status = BAD_DIMEN;
      goto cleanup;
    }

    /* We now know he number of iterator columns */
    numIterCols = startCol;

    /* Fill in iterator information for the parser*/
    histData.numIterCols = numIterCols;
    histData.iterCols = iterCols;
    histData.parsers = parsers;
    histData.infos = infos;
    histData.repeat = repeat;

    /* Set global variables with histogram parameter values.    */
    /* Use separate scalar variables rather than arrays because */
    /* it is more efficient when computing the histogram.       */

    histData.hcolnum[0]  = colnum[0];
    histData.amin1 = tmin[0];
    histData.maxbin1 = maxbin[0];
    histData.binsize1 = tbin[0];
    histData.haxis1 = (long) taxes[0];
    histData.incr[0] = 1;

    if (histData.haxis > 1)
    {
      histData.hcolnum[1]  = colnum[1];
      histData.amin2 = tmin[1];
      histData.maxbin2 = maxbin[1];
      histData.binsize2 = tbin[1];
      histData.haxis2 = (long) taxes[1];
      histData.incr[1] = histData.incr[0] * histData.haxis1;

      if (histData.haxis > 2)
      {
        histData.hcolnum[2]  = colnum[2];
        histData.amin3 = tmin[2];
        histData.maxbin3 = maxbin[2];
        histData.binsize3 = tbin[2];
        histData.haxis3 = (long) taxes[2];
	histData.incr[2] = histData.incr[1] * histData.haxis2;

        if (histData.haxis > 3)
        {
          histData.hcolnum[3]  = colnum[3];
          histData.amin4 = tmin[3];
          histData.maxbin4 = maxbin[3];
          histData.binsize4 = tbin[3];
          histData.haxis4 = (long) taxes[3];
	  histData.incr[3] = histData.incr[2] * histData.haxis3;
        }
      }
    }

    /* define parameters of image for the iterator function */
    fits_iter_set_file(imagepars, histptr);        /* pointer to image */
    fits_iter_set_datatype(imagepars, imagetype);  /* image datatype   */
    fits_iter_set_iotype(imagepars, OutputCol);    /* image is output  */

    /* call the iterator function to write out the histogram image */
    fits_iterate_data(n_cols, imagepars, offset, n_per_loop,
                          ffwritehisto, (void*)&histData, status);
       
 cleanup:
    /* Free any allocated memory ... */
    if (iterCols) free(iterCols);
    /* ... and parsers */
    for (ii = 0; ii <= 4; ii ++) {
      if (parsers[ii].nCols > 0) ffcprs(&(parsers[ii]));
    }
    return(*status);
}